

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMap.c
# Opt level: O0

int Mpm_ManDeriveCuts(Mpm_Man_t *p,Mig_Obj_t *pObj)

{
  Mig_Obj_t *pMVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Mpm_Cut_t *pMVar5;
  Mig_Obj_t *pObj_00;
  bool bVar6;
  Mpm_Cut_t *local_60;
  Mpm_Cut_t *pCut_1;
  Mpm_Cut_t *pMStack_50;
  int Times;
  Mpm_Cut_t *pCut;
  int local_40;
  int c2;
  int c1;
  int c0;
  int hCutBest;
  int Required;
  Mpm_Cut_t *pCut2;
  Mpm_Cut_t *pCut1;
  Mpm_Cut_t *pCut0;
  Mig_Obj_t *pObj_local;
  Mpm_Man_t *p_local;
  
  pCut0 = (Mpm_Cut_t *)pObj;
  pObj_local = (Mig_Obj_t *)p;
  c0 = Mpm_ObjRequired(p,pObj);
  c1 = Mpm_ObjCutBest((Mpm_Man_t *)pObj_local,(Mig_Obj_t *)pCut0);
  iVar2 = Vec_PtrSize((Vec_Ptr_t *)(pObj_local + 0xcb));
  if (iVar2 != (int)pObj_local[1].pFans[1] + 1) {
    __assert_fail("Vec_PtrSize( &p->vFreeUnits ) == p->nNumCuts + 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMap.c"
                  ,0x24e,"int Mpm_ManDeriveCuts(Mpm_Man_t *, Mig_Obj_t *)");
  }
  iVar2 = Mpm_ObjCutList((Mpm_Man_t *)pObj_local,(Mig_Obj_t *)pCut0);
  if (iVar2 != 0) {
    __assert_fail("Mpm_ObjCutList(p, pObj) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMap.c"
                  ,0x24f,"int Mpm_ManDeriveCuts(Mpm_Man_t *, Mig_Obj_t *)");
  }
  pObj_local[4].pFans[2] = (Mig_Fan_t)0x0;
  if (0 < c1) {
    pMStack_50 = Mpm_ObjCutBestP((Mpm_Man_t *)pObj_local,(Mig_Obj_t *)pCut0);
    uVar3 = Mpm_CutGetArrTime((Mpm_Man_t *)pObj_local,pMStack_50);
    iVar2 = c0;
    pCut_1._4_4_ = uVar3;
    if (pMStack_50->hNext != 0) {
      __assert_fail("pCut->hNext == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMap.c"
                    ,0x255,"int Mpm_ManDeriveCuts(Mpm_Man_t *, Mig_Obj_t *)");
    }
    if (c0 < (int)uVar3) {
      uVar4 = Mig_ObjId((Mig_Obj_t *)pCut0);
      printf("Arrival time (%d) exceeds required time (%d) at object %d.\n",(ulong)uVar3,
             (ulong)(uint)iVar2,(ulong)uVar4);
    }
    pMVar1 = pObj_local;
    if (pObj_local[2].pFans[2] == (Mig_Fan_t)0x0) {
      Mpm_ObjSetTime((Mpm_Man_t *)pObj_local,(Mig_Obj_t *)pCut0,pCut_1._4_4_);
    }
    else {
      pMVar5 = Mpm_ManMergeCuts((Mpm_Man_t *)pObj_local,pMStack_50,(Mpm_Cut_t *)0x0,(Mpm_Cut_t *)0x0
                               );
      Mpm_ObjAddCutToStore((Mpm_Man_t *)pMVar1,pMVar5,pCut_1._4_4_);
    }
  }
  iVar2 = Mig_ManChoiceNum(*(Mig_Man_t **)pObj_local->pFans);
  if ((iVar2 != 0) &&
     (iVar2 = Mig_ObjSiblId((Mig_Obj_t *)pCut0), pMVar1 = pObj_local, pMVar5 = pCut0, iVar2 != 0)) {
    pObj_00 = Mig_ObjSibl((Mig_Obj_t *)pCut0);
    Mpm_ObjAddChoiceCutsToStore((Mpm_Man_t *)pMVar1,(Mig_Obj_t *)pMVar5,pObj_00,c0);
  }
  Mpm_ObjPrepareFanins((Mpm_Man_t *)pObj_local,(Mig_Obj_t *)pCut0);
  iVar2 = Mig_ObjIsNode2((Mig_Obj_t *)pCut0);
  if (iVar2 == 0) {
    iVar2 = Mig_ObjIsNode3((Mig_Obj_t *)pCut0);
    if (iVar2 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMap.c"
                    ,0x278,"int Mpm_ManDeriveCuts(Mpm_Man_t *, Mig_Obj_t *)");
    }
    c2 = 0;
    while( true ) {
      bVar6 = false;
      if (c2 < (int)pObj_local[0xcd].pFans[0]) {
        pCut1 = *(Mpm_Cut_t **)(pObj_local[0xce].pFans + (long)c2 * 2);
        bVar6 = pCut1 != (Mpm_Cut_t *)0x0;
      }
      if (!bVar6) break;
      local_40 = 0;
      while( true ) {
        bVar6 = false;
        if (local_40 < (int)pObj_local[0xcd].pFans[1]) {
          pCut2 = *(Mpm_Cut_t **)(pObj_local[0xde].pFans + (long)local_40 * 2 + 2);
          bVar6 = pCut2 != (Mpm_Cut_t *)0x0;
        }
        if (!bVar6) break;
        pCut._4_4_ = 0;
        while( true ) {
          bVar6 = false;
          if (pCut._4_4_ < (int)pObj_local[0xcd].pFans[2]) {
            _hCutBest = *(Mpm_Cut_t **)(pObj_local[0xef].pFans + (long)pCut._4_4_ * 2);
            bVar6 = _hCutBest != (Mpm_Cut_t *)0x0;
          }
          if (!bVar6) break;
          iVar2 = Abc_TtCountOnes(*(ulong *)(pObj_local[0xff].pFans + (long)c2 * 2 + 2) |
                                  *(ulong *)(pObj_local[0x110].pFans + (long)local_40 * 2) |
                                  *(ulong *)(pObj_local[0x120].pFans + (long)pCut._4_4_ * 2 + 2));
          if ((iVar2 <= (int)pObj_local[1].pFans[0]) &&
             (iVar2 = Mpm_ManExploreNewCut
                                ((Mpm_Man_t *)pObj_local,(Mig_Obj_t *)pCut0,pCut1,pCut2,_hCutBest,c0
                                ), iVar2 == 0)) goto LAB_00560876;
          pCut._4_4_ = pCut._4_4_ + 1;
        }
        local_40 = local_40 + 1;
      }
      c2 = c2 + 1;
    }
  }
  else {
    c2 = 0;
    while( true ) {
      bVar6 = false;
      if (c2 < (int)pObj_local[0xcd].pFans[0]) {
        pCut1 = *(Mpm_Cut_t **)(pObj_local[0xce].pFans + (long)c2 * 2);
        bVar6 = pCut1 != (Mpm_Cut_t *)0x0;
      }
      if (!bVar6) break;
      local_40 = 0;
      while( true ) {
        bVar6 = false;
        if (local_40 < (int)pObj_local[0xcd].pFans[1]) {
          pCut2 = *(Mpm_Cut_t **)(pObj_local[0xde].pFans + (long)local_40 * 2 + 2);
          bVar6 = pCut2 != (Mpm_Cut_t *)0x0;
        }
        if (!bVar6) break;
        iVar2 = Abc_TtCountOnes(*(ulong *)(pObj_local[0xff].pFans + (long)c2 * 2 + 2) |
                                *(ulong *)(pObj_local[0x110].pFans + (long)local_40 * 2));
        if ((iVar2 <= (int)pObj_local[1].pFans[0]) &&
           (iVar2 = Mpm_ManExploreNewCut
                              ((Mpm_Man_t *)pObj_local,(Mig_Obj_t *)pCut0,pCut1,pCut2,
                               (Mpm_Cut_t *)0x0,c0), iVar2 == 0)) goto LAB_00560876;
        local_40 = local_40 + 1;
      }
      c2 = c2 + 1;
    }
  }
LAB_00560876:
  if ((int)pObj_local[4].pFans[2] < 1) {
    __assert_fail("p->nCutStore > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMap.c"
                  ,0x27f,"int Mpm_ManDeriveCuts(Mpm_Man_t *, Mig_Obj_t *)");
  }
  if (c0 < **(int **)pObj_local[5].pFans) {
    if (pObj_local[2].pFans[2] != (Mig_Fan_t)0x0) {
      __assert_fail("!p->fMainRun",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMap.c"
                    ,0x28b,"int Mpm_ManDeriveCuts(Mpm_Man_t *, Mig_Obj_t *)");
    }
  }
  else {
    if (c1 != 0) {
      Mmr_StepRecycle(*(Mmr_Step_t **)pObj_local[4].pFans,c1);
    }
    c1 = Mpm_CutCreate((Mpm_Man_t *)pObj_local,(Mpm_Cut_t *)(*(long *)pObj_local[5].pFans + 0x1c),
                       &local_60);
    Mpm_ObjSetCutBest((Mpm_Man_t *)pObj_local,(Mig_Obj_t *)pCut0,c1);
    Mpm_ObjSetTime((Mpm_Man_t *)pObj_local,(Mig_Obj_t *)pCut0,**(int **)pObj_local[5].pFans);
    Mpm_ObjSetArea((Mpm_Man_t *)pObj_local,(Mig_Obj_t *)pCut0,
                   *(int *)(*(long *)pObj_local[5].pFans + 4));
    Mpm_ObjSetEdge((Mpm_Man_t *)pObj_local,(Mig_Obj_t *)pCut0,
                   *(int *)(*(long *)pObj_local[5].pFans + 8));
  }
  if (c1 < 1) {
    __assert_fail("hCutBest > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMap.c"
                  ,0x28c,"int Mpm_ManDeriveCuts(Mpm_Man_t *, Mig_Obj_t *)");
  }
  Mpm_ObjTranslateCutsFromStore((Mpm_Man_t *)pObj_local,(Mig_Obj_t *)pCut0);
  Mpm_ObjDerefFaninCuts((Mpm_Man_t *)pObj_local,(Mig_Obj_t *)pCut0);
  return 1;
}

Assistant:

int Mpm_ManDeriveCuts( Mpm_Man_t * p, Mig_Obj_t * pObj )
{
    Mpm_Cut_t * pCut0, * pCut1, * pCut2;
    int Required = Mpm_ObjRequired( p, pObj );
    int hCutBest = Mpm_ObjCutBest( p, pObj );
    int c0, c1, c2;
#ifdef MIG_RUNTIME
abctime clk;
#endif

    assert( Vec_PtrSize( &p->vFreeUnits ) == p->nNumCuts + 1 );
    assert( Mpm_ObjCutList(p, pObj) == 0 );
    p->nCutStore = 0;
    if ( hCutBest > 0 ) // cut list is assigned
    {
        Mpm_Cut_t * pCut = Mpm_ObjCutBestP( p, pObj ); 
        int Times = Mpm_CutGetArrTime( p, pCut );
        assert( pCut->hNext == 0 );
        if ( Times > Required )
            printf( "Arrival time (%d) exceeds required time (%d) at object %d.\n", Times, Required, Mig_ObjId(pObj) );
        if ( p->fMainRun )
            Mpm_ObjAddCutToStore( p, Mpm_ManMergeCuts(p, pCut, NULL, NULL), Times );
        else
            Mpm_ObjSetTime( p, pObj, Times );
    }
    // start storage with choice cuts
    if ( Mig_ManChoiceNum(p->pMig) && Mig_ObjSiblId(pObj) )
        Mpm_ObjAddChoiceCutsToStore( p, pObj, Mig_ObjSibl(pObj), Required );

#ifdef MIG_RUNTIME
clk = Abc_Clock();
#endif
    Mpm_ObjPrepareFanins( p, pObj );
    if ( Mig_ObjIsNode2(pObj) )
    {
        // go through cut pairs
        for ( c0 = 0; c0 < p->nCuts[0] && (pCut0 = p->pCuts[0][c0]); c0++ )
        for ( c1 = 0; c1 < p->nCuts[1] && (pCut1 = p->pCuts[1][c1]); c1++ )
            if ( Abc_TtCountOnes(p->pSigns[0][c0] | p->pSigns[1][c1]) <= p->nLutSize )
                if ( !Mpm_ManExploreNewCut( p, pObj, pCut0, pCut1, NULL, Required ) )
                    goto finish;
    }
    else if ( Mig_ObjIsNode3(pObj) )
    {
        // go through cut triples
        for ( c0 = 0; c0 < p->nCuts[0] && (pCut0 = p->pCuts[0][c0]); c0++ )
        for ( c1 = 0; c1 < p->nCuts[1] && (pCut1 = p->pCuts[1][c1]); c1++ )
        for ( c2 = 0; c2 < p->nCuts[2] && (pCut2 = p->pCuts[2][c2]); c2++ )
            if ( Abc_TtCountOnes(p->pSigns[0][c0] | p->pSigns[1][c1] | p->pSigns[2][c2]) <= p->nLutSize )
                if ( !Mpm_ManExploreNewCut( p, pObj, pCut0, pCut1, pCut2, Required ) )
                    goto finish;
    }
    else assert( 0 );
#ifdef MIG_RUNTIME
p->timeDerive += Abc_Clock() - clk;
#endif

finish:
    // save best cut
    assert( p->nCutStore > 0 );
    if ( p->pCutStore[0]->mTime <= Required )
    {
        Mpm_Cut_t * pCut;
        if ( hCutBest )
            Mmr_StepRecycle( p->pManCuts, hCutBest );
        hCutBest = Mpm_CutCreate( p, &p->pCutStore[0]->pCut, &pCut );
        Mpm_ObjSetCutBest( p, pObj, hCutBest );
        Mpm_ObjSetTime( p, pObj, p->pCutStore[0]->mTime );
        Mpm_ObjSetArea( p, pObj, p->pCutStore[0]->mArea );
        Mpm_ObjSetEdge( p, pObj, p->pCutStore[0]->mEdge );
    }
    else assert( !p->fMainRun );
    assert( hCutBest > 0 );
    // transform internal storage into regular cuts
    Mpm_ObjTranslateCutsFromStore( p, pObj );
    // dereference fanin cuts and reference node
    Mpm_ObjDerefFaninCuts( p, pObj );
    return 1;
}